

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O2

Vec_Str_t * Saig_SynchSequence(Aig_Man_t *pAig,int nWords)

{
  uint uVar1;
  uint uVar2;
  Vec_Str_t *vSequence;
  char *pcVar3;
  Vec_Ptr_t *vSimInfo;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iPatBest;
  ulong local_38;
  
  if (pAig->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                  ,0x19c,"Vec_Str_t *Saig_SynchSequence(Aig_Man_t *, int)");
  }
  Aig_ManRandom(1);
  iVar5 = pAig->nRegs * 0x14;
  vSequence = (Vec_Str_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar7 = iVar5;
  }
  vSequence->nSize = 0;
  vSequence->nCap = iVar7;
  uVar4 = 0;
  if (iVar7 == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)malloc((long)iVar7);
  }
  vSequence->pArray = pcVar3;
  vSimInfo = Vec_PtrAllocSimInfo(pAig->vObjs->nSize,nWords);
  Saig_SynchSetConstant1(pAig,vSimInfo,nWords);
  uVar6 = pAig->nRegs;
  Saig_SynchInitRegsTernary(pAig,vSimInfo,nWords);
  while (((uint)uVar4 < 100 && (0 < (int)uVar6))) {
    iVar7 = 0x65;
    local_38 = uVar4;
    do {
      iVar7 = iVar7 + -1;
      if (iVar7 == 0) goto LAB_0059dfe0;
      Saig_SynchInitPisRandom(pAig,vSimInfo,nWords);
      Saig_SynchTernarySimulate(pAig,vSimInfo,nWords);
      uVar1 = Saig_SynchCountX(pAig,vSimInfo,nWords,&iPatBest);
    } while ((int)uVar6 <= (int)uVar1);
    uVar2 = Saig_SynchSavePattern(pAig,vSimInfo,nWords,iPatBest,vSequence);
    uVar4 = (ulong)((int)local_38 + 1);
    uVar6 = uVar1;
    if (uVar1 != uVar2) {
      __assert_fail("nTerCur == nTerCur2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                    ,0x1b4,"Vec_Str_t *Saig_SynchSequence(Aig_Man_t *, int)");
    }
  }
  if ((int)uVar6 < 1) {
    iVar7 = Saig_SynchSequenceRun(pAig,vSimInfo,vSequence,1);
    if (iVar7 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                    ,0x1c2,"Vec_Str_t *Saig_SynchSequence(Aig_Man_t *, int)");
    }
    Aig_ManCleanMarkA(pAig);
    Vec_PtrFree(vSimInfo);
  }
  else {
LAB_0059dfe0:
    printf("Count not initialize %d registers.\n",(ulong)uVar6);
    Vec_PtrFree(vSimInfo);
    Vec_StrFree(vSequence);
    vSequence = (Vec_Str_t *)0x0;
  }
  return vSequence;
}

Assistant:

Vec_Str_t * Saig_SynchSequence( Aig_Man_t * pAig, int nWords )
{
    int nStepsMax = 100;  // the maximum number of simulation steps
    int nTriesMax = 100;  // the maximum number of attempts at each step
    int fVerify   =   1;  // verify the resulting pattern
    Vec_Str_t * vSequence;
    Vec_Ptr_t * vSimInfo;
    int nTerPrev, nTerCur = 0, nTerCur2;
    int iPatBest, RetValue, s, t;
    assert( Saig_ManRegNum(pAig) > 0 );
    // reset random numbers
    Aig_ManRandom( 1 );
    // start the sequence
    vSequence = Vec_StrAlloc( 20 * Saig_ManRegNum(pAig) );
    // create sim info and init registers
    vSimInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pAig), nWords );
    Saig_SynchSetConstant1( pAig, vSimInfo, nWords );
    // iterate over the timeframes
    nTerPrev = Saig_ManRegNum(pAig);
    Saig_SynchInitRegsTernary( pAig, vSimInfo, nWords );
    for ( s = 0; s < nStepsMax && nTerPrev > 0; s++ )
    {
        for ( t = 0; t < nTriesMax; t++ )
        {
            Saig_SynchInitPisRandom( pAig, vSimInfo, nWords );
            Saig_SynchTernarySimulate( pAig, vSimInfo, nWords );
            nTerCur = Saig_SynchCountX( pAig, vSimInfo, nWords, &iPatBest );
            if ( nTerCur < nTerPrev )
                break;
        }
        if ( t == nTriesMax )
            break;
        nTerCur2 = Saig_SynchSavePattern( pAig, vSimInfo, nWords, iPatBest, vSequence );
        assert( nTerCur == nTerCur2 );
        nTerPrev = nTerCur;
    }
    if ( nTerPrev > 0 )
    {
        printf( "Count not initialize %d registers.\n", nTerPrev );
        Vec_PtrFree( vSimInfo );
        Vec_StrFree( vSequence );
        return NULL;
    }
    // verify that the sequence is correct
    if ( fVerify )
    {
        RetValue = Saig_SynchSequenceRun( pAig, vSimInfo, vSequence, 1 );
        assert( RetValue == 0 );
        Aig_ManCleanMarkA( pAig );
    }
    Vec_PtrFree( vSimInfo );
    return vSequence;
}